

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t
add_to_list(_internal_exr_context *ctxt,exr_attribute_list_t *list,exr_attribute_t *nattr,char *name
           )

{
  ulong uVar1;
  exr_attribute_t *peVar2;
  int iVar3;
  exr_result_t eVar4;
  exr_attribute_t **ppeVar5;
  long lVar6;
  exr_attr_chromaticities_t *peVar7;
  exr_attr_m33d_t *peVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  exr_attribute_t **ppeVar12;
  
  iVar3 = list->num_attributes;
  lVar9 = (long)iVar3;
  uVar1 = lVar9 + 1;
  if (iVar3 < list->num_alloced) {
    ppeVar5 = list->entries;
    ppeVar12 = list->sorted_entries;
  }
  else {
    uVar10 = (long)list->num_alloced * 2;
    uVar11 = lVar9 + 2;
    if (uVar1 <= uVar10) {
      uVar11 = uVar10;
    }
    ppeVar5 = (exr_attribute_t **)(*ctxt->alloc_fn)(uVar11 << 4);
    if (ppeVar5 == (exr_attribute_t **)0x0) {
      (*ctxt->free_fn)(nattr);
      eVar4 = (*ctxt->standard_error)(ctxt,1);
      return eVar4;
    }
    list->num_alloced = (int)uVar11;
    ppeVar12 = ppeVar5 + uVar11;
    if (0 < iVar3) {
      lVar6 = 0;
      do {
        ppeVar5[lVar6] = list->entries[lVar6];
        ppeVar12[lVar6] = list->sorted_entries[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar9 != lVar6);
    }
    if (list->entries != (exr_attribute_t **)0x0) {
      (*ctxt->free_fn)(list->entries);
    }
    list->entries = ppeVar5;
    list->sorted_entries = ppeVar12;
  }
  ppeVar5[lVar9] = nattr;
  ppeVar12[lVar9] = nattr;
  uVar10 = uVar1;
  if (0 < iVar3) {
    do {
      peVar2 = ppeVar12[uVar10 - 2];
      iVar3 = strcmp(nattr->name,peVar2->name);
      if (-1 < iVar3) break;
      ppeVar12[uVar10 - 1] = peVar2;
      ppeVar12[uVar10 - 2] = nattr;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  list->num_attributes = (int)uVar1;
  switch(nattr->type) {
  case EXR_ATTR_BOX2I:
  case EXR_ATTR_BOX2F:
  case EXR_ATTR_CHLIST:
  case EXR_ATTR_FLOAT_VECTOR:
  case EXR_ATTR_STRING:
  case EXR_ATTR_STRING_VECTOR:
  case EXR_ATTR_V2D:
    peVar8 = (nattr->field_6).m33d;
    goto LAB_0011a048;
  case EXR_ATTR_CHROMATICITIES:
    peVar8 = (nattr->field_6).m33d;
    goto LAB_0011a02d;
  case EXR_ATTR_COMPRESSION:
  case EXR_ATTR_ENVMAP:
  case EXR_ATTR_LINEORDER:
    (nattr->field_6).uc = '\0';
    break;
  case EXR_ATTR_DOUBLE:
    (nattr->field_6).d = 0.0;
    break;
  case EXR_ATTR_FLOAT:
  case EXR_ATTR_INT:
    (nattr->field_6).f = 0.0;
    break;
  case EXR_ATTR_KEYCODE:
    peVar8 = (nattr->field_6).m33d;
    *(undefined8 *)((long)peVar8->m + 0xc) = 0;
    *(undefined8 *)((long)peVar8->m + 0x14) = 0;
    goto LAB_0011a048;
  case EXR_ATTR_M33F:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    *(undefined4 *)(peVar8->m + 4) = 0;
    break;
  case EXR_ATTR_M33D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[6] = 0.0;
    peVar8->m[7] = 0.0;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[8] = 0.0;
    break;
  case EXR_ATTR_M44F:
  case EXR_ATTR_M44D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[6] = 0.0;
    peVar8->m[7] = 0.0;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
LAB_0011a02d:
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
LAB_0011a048:
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    break;
  case EXR_ATTR_PREVIEW:
  case EXR_ATTR_V3D:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[2] = 0.0;
    break;
  case EXR_ATTR_RATIONAL:
  case EXR_ATTR_TIMECODE:
  case EXR_ATTR_V2I:
  case EXR_ATTR_V2F:
    peVar7 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    goto LAB_0011a006;
  case EXR_ATTR_TILEDESC:
    peVar7 = (exr_attr_chromaticities_t *)(nattr->field_6).m33d;
    *(undefined1 *)&peVar7->green_x = 0;
    goto LAB_0011a006;
  case EXR_ATTR_V3I:
  case EXR_ATTR_V3F:
    peVar7 = (nattr->field_6).chromaticities;
    peVar7->green_x = 0.0;
LAB_0011a006:
    peVar7->red_x = 0.0;
    peVar7->red_y = 0.0;
    break;
  case EXR_ATTR_OPAQUE:
    peVar8 = (nattr->field_6).m33d;
    peVar8->m[4] = 0.0;
    peVar8->m[5] = 0.0;
    peVar8->m[2] = 0.0;
    peVar8->m[3] = 0.0;
    peVar8->m[0] = 0.0;
    peVar8->m[1] = 0.0;
    peVar8->m[6] = 0.0;
    break;
  default:
    (*ctxt->print_error)(ctxt,3,"Invalid / unimplemented type (%s) in attr_init",nattr->type_name);
    exr_attr_list_remove((exr_context_t)ctxt,list,nattr);
    return 3;
  }
  return 0;
}

Assistant:

static exr_result_t
add_to_list (
    struct _internal_exr_context* ctxt,
    exr_attribute_list_t*         list,
    exr_attribute_t*              nattr,
    const char*                   name)
{
    int               cattrsz = list->num_attributes;
    int               nattrsz = cattrsz + 1;
    int               insertpos;
    exr_attribute_t** attrs        = list->entries;
    exr_attribute_t** sorted_attrs = list->sorted_entries;
    exr_result_t      rv           = EXR_ERR_SUCCESS;

    (void) name;
    if (nattrsz > list->num_alloced)
    {
        size_t nsize = (size_t) (list->num_alloced) * 2;
        if ((size_t) nattrsz > nsize) nsize = (size_t) (nattrsz) + 1;
        attrs = (exr_attribute_t**) ctxt->alloc_fn (
            sizeof (exr_attribute_t*) * nsize * 2);
        if (!attrs)
        {
            ctxt->free_fn (nattr);
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        }

        list->num_alloced = (int32_t) nsize;
        sorted_attrs      = attrs + nsize;

        for (int i = 0; i < cattrsz; ++i)
        {
            attrs[i]        = list->entries[i];
            sorted_attrs[i] = list->sorted_entries[i];
        }

        if (list->entries) ctxt->free_fn (list->entries);
        list->entries        = attrs;
        list->sorted_entries = sorted_attrs;
    }
    attrs[cattrsz]        = nattr;
    sorted_attrs[cattrsz] = nattr;
    insertpos             = cattrsz - 1;

    // FYI: qsort is shockingly slow, just do a quick search and
    // bubble it up until it's in the correct location
    while (insertpos >= 0)
    {
        exr_attribute_t* prev = sorted_attrs[insertpos];

        if (strcmp (nattr->name, prev->name) >= 0) break;

        sorted_attrs[insertpos + 1] = prev;
        sorted_attrs[insertpos]     = nattr;
        --insertpos;
    }

    list->num_attributes = nattrsz;
    rv                   = attr_init (ctxt, nattr);
    if (rv != EXR_ERR_SUCCESS)
        exr_attr_list_remove ((exr_context_t) ctxt, list, nattr);
    return rv;
}